

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.cpp
# Opt level: O2

void __thiscall TGAImage::clear(TGAImage *this)

{
  allocator_type local_2a;
  value_type_conflict local_29;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  local_29 = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_28,
             (ulong)(this->height * this->width * this->bytespp),&local_29,&local_2a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(&this->data,&local_28);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_28);
  return;
}

Assistant:

void TGAImage::clear() { data = std::vector<std::uint8_t>(width * height * bytespp, 0); }